

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * EvaluateSequence(ExpressionEvalContext *ctx,ExprSequence *expression)

{
  bool bVar1;
  uint uVar2;
  ExprBase **ppEVar3;
  StackFrame **ppSVar4;
  ExprBase *this;
  uint local_2c;
  ExprBase *pEStack_28;
  uint i;
  ExprBase *result;
  ExprSequence *expression_local;
  ExpressionEvalContext *ctx_local;
  
  bVar1 = AddInstruction(ctx);
  if (bVar1) {
    pEStack_28 = &ExpressionContext::get<ExprVoid>(ctx->ctx)->super_ExprBase;
    ExprVoid::ExprVoid((ExprVoid *)pEStack_28,(expression->super_ExprBase).source,ctx->ctx->typeVoid
                      );
    for (local_2c = 0; uVar2 = SmallArray<ExprBase_*,_4U>::size(&expression->expressions),
        local_2c < uVar2; local_2c = local_2c + 1) {
      ppEVar3 = SmallArray<ExprBase_*,_4U>::operator[](&expression->expressions,local_2c);
      pEStack_28 = Evaluate(ctx,*ppEVar3);
      if (pEStack_28 == (ExprBase *)0x0) {
        return (ExprBase *)0x0;
      }
    }
    bVar1 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::empty(&ctx->stackFrames);
    if ((!bVar1) &&
       (ppSVar4 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames),
       (*ppSVar4)->targetYield != 0)) {
      this = &ExpressionContext::get<ExprVoid>(ctx->ctx)->super_ExprBase;
      ExprVoid::ExprVoid((ExprVoid *)this,(expression->super_ExprBase).source,ctx->ctx->typeVoid);
      return this;
    }
    ctx_local = (ExpressionEvalContext *)CheckType(&expression->super_ExprBase,pEStack_28);
  }
  else {
    ctx_local = (ExpressionEvalContext *)0x0;
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* EvaluateSequence(ExpressionEvalContext &ctx, ExprSequence *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *result = new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	for(unsigned i = 0; i < expression->expressions.size(); i++)
	{
		result = Evaluate(ctx, expression->expressions[i]);

		if(!result)
			return NULL;
	}

	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	return CheckType(expression, result);
}